

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

void __thiscall AmpIO::AmpIO(AmpIO *this,uint8_t board_id)

{
  long lVar1;
  
  FpgaIO::FpgaIO(&this->super_FpgaIO,board_id);
  (this->super_FpgaIO).super_BoardIO._vptr_BoardIO = (_func_int **)&PTR_InitBoard_00115970;
  this->NumMotors = 0;
  this->NumEncoders = 0;
  this->NumDouts = 0;
  lVar1 = 0x240;
  do {
    EncoderVelocity::Init((EncoderVelocity *)((long)this->ReadBuffer + lVar1 + -0x3c));
    lVar1 = lVar1 + 0x38;
  } while (lVar1 != 0x5c0);
  this->dallasState = ST_DALLAS_START;
  this->dallasTimeoutSec = 10.0;
  this->collect_state = false;
  this->collect_cb = (CollectCallback)0x0;
  memset(this->ReadBuffer,0,0x200);
  (**(this->super_FpgaIO).super_BoardIO._vptr_BoardIO)(this);
  return;
}

Assistant:

AmpIO::AmpIO(uint8_t board_id) : FpgaIO(board_id), NumMotors(0), NumEncoders(0), NumDouts(0),
                                     dallasState(ST_DALLAS_START), dallasTimeoutSec(10.0), collect_state(false), collect_cb(0)
{
    memset(ReadBuffer, 0, sizeof(ReadBuffer));
    memset(WriteBuffer, 0, sizeof(WriteBuffer));
    // Calling InitBoard here will initialize as a 4-axis QLA.
    // InitBoard should be called again from BasePort::AddBoard
    InitBoard();
}